

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw_feature_if_needed(Mesh *this,Selection *s)

{
  Vertex *v;
  Halfedge *h;
  
  if (s->element != (HalfedgeElement *)0x0) {
    glDisable(0xb71);
    v = HalfedgeElement::getVertex(s->element);
    if (v != (Vertex *)0x0) {
      draw_vertex(this,v);
    }
    h = HalfedgeElement::getHalfedge(s->element);
    if (h != (Halfedge *)0x0) {
      draw_halfedge_arrow(this,h);
    }
    glEnable(0xb71);
    return;
  }
  return;
}

Assistant:

void Mesh::draw_feature_if_needed( Selection *s ) const
{

  if( s->element == NULL ) return;

  glDisable(GL_DEPTH_TEST);

  const Vertex *v = s->element->getVertex();
  if (v != nullptr) {
    draw_vertex( v );
  }
  const Halfedge *h = s->element->getHalfedge();
  if (h != nullptr) {
    draw_halfedge_arrow( h );
  }

  glEnable(GL_DEPTH_TEST);
}